

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::BenchmarkImp::Threads(BenchmarkImp *this,int t)

{
  int in_ESI;
  value_type *in_RDI;
  CheckHandler *this_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe0;
  byte bVar1;
  CheckHandler local_18 [3];
  
  bVar1 = 0;
  if (in_ESI < 1) {
    this_00 = local_18;
    CheckHandler::CheckHandler
              ((CheckHandler *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (char *)in_stack_ffffffffffffffd0,(char *)in_RDI,(int)((ulong)this_00 >> 0x20));
    bVar1 = 1;
    CheckHandler::GetLog(this_00);
  }
  else {
    GetNullLogInstance();
  }
  if ((bVar1 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::push_back(in_stack_ffffffffffffffd0,in_RDI);
    return;
  }
  CheckHandler::~CheckHandler((CheckHandler *)&LAB_001669bc);
}

Assistant:

void BenchmarkImp::Threads(int t) {
  CHECK_GT(t, 0);
  thread_counts_.push_back(t);
}